

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_allreduce_1phase_multiple
          (bsc_step_t depends,bsc_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  bsc_pid_t local_48;
  bsc_step_t local_44;
  int local_40;
  bsc_step_t finished;
  bsc_size_t i;
  bsc_pid_t P;
  group_t *g;
  bsc_size_t n_local;
  bsc_coll_params_t *params_local;
  bsc_group_t group_local;
  bsc_pid_t root_local;
  bsc_step_t depends_local;
  
  if (group == (bsc_group_t)0x0) {
    local_48 = bsp_nprocs();
  }
  else {
    local_48 = *group;
  }
  local_44 = depends;
  for (local_40 = 0; local_40 < n; local_40 = local_40 + 1) {
    local_44 = bsc_allreduce_qtree_single
                         (depends,group,params[local_40].src,params[local_40].dst,
                          params[local_40].tmp,params[local_40].reducer,params[local_40].zero,
                          params[local_40].nmemb,params[local_40].size,local_48);
  }
  return local_44;
}

Assistant:

bsc_step_t bsc_allreduce_1phase_multiple( bsc_step_t depends,
                      bsc_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs() ;
    bsc_size_t i;
    bsc_step_t finished = depends;
    (void) root;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_allreduce_qtree_single( depends, group,
                   params[i].src, params[i].dst, params[i].tmp,
                   params[i].reducer, params[i].zero, 
                   params[i].nmemb, params[i].size, P );
    }

    return finished;
}